

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall CharConvHex::putch(CharConvHex *this,char **buf,wchar_t ch,int idx,int pct)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint in_ECX;
  wchar_t in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int n;
  int d;
  int local_34;
  
  iVar3 = is_xdigit(L'\0');
  if (iVar3 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = value_of_xdigit(in_EDX);
  }
  bVar2 = (**(code **)(*in_RDI + 0x50))(in_RDI,local_34,in_ECX & 1);
  if ((in_ECX & 1) == 0) {
    *(byte *)*in_RSI = bVar2;
  }
  else {
    pbVar1 = (byte *)*in_RSI;
    *in_RSI = pbVar1 + 1;
    *pbVar1 = *pbVar1 | bVar2;
  }
  return;
}

Assistant:

virtual void putch(char *&buf, wchar_t ch, int idx, int pct)
    {
        /* get the nibble value from the character */
        int d = is_xdigit(ch) ? value_of_xdigit(ch) : 0;
        int n = nibble_to_byte(d, idx & 1);

        /* 
         *   if this is an even index, it's the first nibble of the byte, so
         *   set the whole byte to the nibble value; if it's an odd index,
         *   it's the second nibble for the byte, so OR it into the byte and
         *   increment the output pointer 
         */
        if (idx & 1)
            *buf++ |= (char)n;
        else
            *buf = (char)n;
    }